

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_keyboard_events.c
# Opt level: O0

int main(int argc,char **argv)

{
  ALLEGRO_EVENT_QUEUE *pAVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  
  uVar2 = al_install_system(0x85020700,atexit);
  if ((uVar2 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  open_log_monospace();
  display = (ALLEGRO_DISPLAY *)al_create_display(0x280,0x1e0);
  if (display == (ALLEGRO_DISPLAY *)0x0) {
    abort_example("al_create_display failed\n");
  }
  uVar4 = 0;
  uVar3 = al_map_rgb_f(0);
  al_clear_to_color(uVar3,uVar4);
  al_flip_display();
  uVar2 = al_install_keyboard();
  if ((uVar2 & 1) == 0) {
    abort_example("al_install_keyboard failed\n");
  }
  event_queue = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
  if (event_queue == (ALLEGRO_EVENT_QUEUE *)0x0) {
    abort_example("al_create_event_queue failed\n");
  }
  pAVar1 = event_queue;
  uVar3 = al_get_keyboard_event_source();
  al_register_event_source(pAVar1,uVar3);
  pAVar1 = event_queue;
  uVar3 = al_get_display_event_source(display);
  al_register_event_source(pAVar1,uVar3);
  main_loop();
  close_log(false);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log_monospace();

   display = al_create_display(WIDTH, HEIGHT);
   if (!display) {
      abort_example("al_create_display failed\n");
   }
   al_clear_to_color(al_map_rgb_f(0, 0, 0));
   al_flip_display();

   if (!al_install_keyboard()) {
      abort_example("al_install_keyboard failed\n");
   }

   event_queue = al_create_event_queue();
   if (!event_queue) {
      abort_example("al_create_event_queue failed\n");
   }

   al_register_event_source(event_queue, al_get_keyboard_event_source());
   al_register_event_source(event_queue, al_get_display_event_source(display));

   main_loop();

   close_log(false);

   return 0;
}